

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O2

void __thiscall tf::NonblockingNotifierV2::notify_n(NonblockingNotifierV2 *this,size_t n)

{
  bool bVar1;
  
  if ((ulong)((long)(this->_waiters).
                    super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_waiters).
                    super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 7) <= n) {
    _notify<true>(this);
    return;
  }
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    _notify<false>(this);
  }
  return;
}

Assistant:

void notify_n(size_t n) {
    if(n >= _waiters.size()) {
      _notify<true>();
    }
    else {
      for(size_t k=0; k<n; ++k) {
        _notify<false>();
      }
    }
  }